

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void snga_dot_local_patch
               (Integer atype,Integer andim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,int *alen,void *retval)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long local_e8 [7];
  long alStack_b0 [8];
  long alStack_70 [6];
  Integer baseldA [7];
  
  lVar17 = 1;
  for (lVar10 = 1; lVar10 < andim; lVar10 = lVar10 + 1) {
    lVar17 = lVar17 * ((hiA[lVar10] - loA[lVar10]) + 1);
  }
  local_e8[0] = 0;
  local_e8[1] = 0;
  alStack_70[1] = 1;
  alStack_70[2] = 1;
  alStack_b0[1] = *ldA;
  alStack_b0[2] = *ldA * ldA[1];
  for (lVar10 = 2; lVar10 < andim; lVar10 = lVar10 + 1) {
    local_e8[lVar10] = 0;
    alStack_70[lVar10 + 1] = ((hiA[lVar10 + -1] - loA[lVar10 + -1]) + 1) * alStack_70[lVar10];
    alStack_b0[lVar10 + 1] = ldA[lVar10] * alStack_b0[lVar10];
  }
  switch(atype) {
  case 0x3e9:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    iVar11 = 0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar13 = 1; lVar13 < andim; lVar13 = lVar13 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar13] * local_e8[lVar13];
        lVar15 = local_e8[lVar13] + (ulong)(lVar10 % alStack_70[lVar13 + 1] == 0);
        lVar16 = 0;
        if (lVar15 <= hiA[lVar13] - loA[lVar13]) {
          lVar16 = lVar15;
        }
        local_e8[lVar13] = lVar16;
      }
      for (lVar13 = 0; lVar13 <= *hiA - *loA; lVar13 = lVar13 + 1) {
        iVar11 = iVar11 + *(int *)((long)B_ptr + lVar13 * 4 + lVar14 * 4) *
                          *(int *)((long)A_ptr + lVar13 * 4 + lVar14 * 4);
      }
    }
    *alen = *alen + iVar11;
    break;
  case 0x3ea:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    lVar13 = 0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar16 = 1; lVar16 < andim; lVar16 = lVar16 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar16] * local_e8[lVar16];
        lVar12 = local_e8[lVar16] + (ulong)(lVar10 % alStack_70[lVar16 + 1] == 0);
        lVar15 = 0;
        if (lVar12 <= hiA[lVar16] - loA[lVar16]) {
          lVar15 = lVar12;
        }
        local_e8[lVar16] = lVar15;
      }
      for (lVar16 = 0; lVar16 <= *hiA - *loA; lVar16 = lVar16 + 1) {
        lVar13 = lVar13 + *(long *)((long)B_ptr + lVar16 * 8 + lVar14 * 8) *
                          *(long *)((long)A_ptr + lVar16 * 8 + lVar14 * 8);
      }
    }
    *(long *)alen = *(long *)alen + lVar13;
    break;
  case 0x3eb:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    fVar18 = 0.0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar13 = 1; lVar13 < andim; lVar13 = lVar13 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar13] * local_e8[lVar13];
        lVar15 = local_e8[lVar13] + (ulong)(lVar10 % alStack_70[lVar13 + 1] == 0);
        lVar16 = 0;
        if (lVar15 <= hiA[lVar13] - loA[lVar13]) {
          lVar16 = lVar15;
        }
        local_e8[lVar13] = lVar16;
      }
      for (lVar13 = 0; lVar13 <= *hiA - *loA; lVar13 = lVar13 + 1) {
        fVar18 = fVar18 + *(float *)((long)A_ptr + lVar13 * 4 + lVar14 * 4) *
                          *(float *)((long)B_ptr + lVar13 * 4 + lVar14 * 4);
      }
    }
    *alen = (int)(fVar18 + (float)*alen);
    break;
  case 0x3ec:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    dVar6 = 0.0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar13 = 1; lVar13 < andim; lVar13 = lVar13 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar13] * local_e8[lVar13];
        lVar15 = local_e8[lVar13] + (ulong)(lVar10 % alStack_70[lVar13 + 1] == 0);
        lVar16 = 0;
        if (lVar15 <= hiA[lVar13] - loA[lVar13]) {
          lVar16 = lVar15;
        }
        local_e8[lVar13] = lVar16;
      }
      for (lVar13 = 0; lVar13 <= *hiA - *loA; lVar13 = lVar13 + 1) {
        dVar6 = dVar6 + *(double *)((long)A_ptr + lVar13 * 8 + lVar14 * 8) *
                        *(double *)((long)B_ptr + lVar13 * 8 + lVar14 * 8);
      }
    }
    *(double *)alen = dVar6 + *(double *)alen;
    break;
  default:
    pnga_error("snga_dot_local_patch: type not supported",atype);
    return;
  case 0x3ee:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    fVar18 = 0.0;
    fVar19 = 0.0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar13 = 1; lVar13 < andim; lVar13 = lVar13 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar13] * local_e8[lVar13];
        lVar15 = local_e8[lVar13] + (ulong)(lVar10 % alStack_70[lVar13 + 1] == 0);
        lVar16 = 0;
        if (lVar15 <= hiA[lVar13] - loA[lVar13]) {
          lVar16 = lVar15;
        }
        local_e8[lVar13] = lVar16;
      }
      for (lVar13 = 0; lVar13 <= *hiA - *loA; lVar13 = lVar13 + 1) {
        fVar1 = *(float *)((long)B_ptr + lVar13 * 8 + lVar14 * 8);
        fVar2 = *(float *)((long)B_ptr + lVar13 * 8 + lVar14 * 8 + 4);
        uVar4 = *(undefined8 *)((long)A_ptr + lVar13 * 8 + lVar14 * 8);
        fVar20 = (float)uVar4;
        fVar21 = (float)((ulong)uVar4 >> 0x20);
        fVar18 = fVar18 + fVar1 * fVar20 + fVar21 * -fVar2;
        fVar19 = fVar19 + fVar1 * fVar21 + fVar20 * fVar2;
      }
    }
    *(ulong *)alen =
         CONCAT44(fVar19 + (float)((ulong)*(undefined8 *)alen >> 0x20),
                  fVar18 + (float)*(undefined8 *)alen);
    break;
  case 0x3ef:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    dVar6 = 0.0;
    dVar7 = 0.0;
    while (lVar10 != lVar17) {
      lVar10 = lVar10 + 1;
      lVar14 = 0;
      for (lVar13 = 1; lVar13 < andim; lVar13 = lVar13 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar13] * local_e8[lVar13];
        lVar15 = local_e8[lVar13] + (ulong)(lVar10 % alStack_70[lVar13 + 1] == 0);
        lVar16 = 0;
        if (lVar15 <= hiA[lVar13] - loA[lVar13]) {
          lVar16 = lVar15;
        }
        local_e8[lVar13] = lVar16;
      }
      lVar14 = lVar14 << 4;
      for (lVar13 = 0; lVar13 <= *hiA - *loA; lVar13 = lVar13 + 1) {
        dVar3 = *(double *)((long)B_ptr + lVar14 + 8);
        dVar8 = *(double *)((long)A_ptr + lVar14);
        dVar9 = ((double *)((long)A_ptr + lVar14))[1];
        dVar6 = dVar6 + *(double *)((long)B_ptr + lVar14) * dVar8 + dVar9 * -dVar3;
        dVar7 = dVar7 + *(double *)((long)B_ptr + lVar14) * dVar9 + dVar8 * dVar3;
        lVar14 = lVar14 + 0x10;
      }
    }
    auVar5._8_4_ = SUB84(dVar7 + *(double *)(alen + 2),0);
    auVar5._0_8_ = dVar6 + *(double *)alen;
    auVar5._12_4_ = (int)((ulong)(dVar7 + *(double *)(alen + 2)) >> 0x20);
    *(undefined1 (*) [16])alen = auVar5;
    break;
  case 0x3f8:
    lVar10 = 0;
    if (lVar17 < 1) {
      lVar17 = lVar10;
    }
    lVar13 = 0;
    while (lVar13 != lVar17) {
      lVar13 = lVar13 + 1;
      lVar14 = 0;
      for (lVar16 = 1; lVar16 < andim; lVar16 = lVar16 + 1) {
        lVar14 = lVar14 + alStack_b0[lVar16] * local_e8[lVar16];
        lVar12 = local_e8[lVar16] + (ulong)(lVar13 % alStack_70[lVar16 + 1] == 0);
        lVar15 = 0;
        if (lVar12 <= hiA[lVar16] - loA[lVar16]) {
          lVar15 = lVar12;
        }
        local_e8[lVar16] = lVar15;
      }
      for (lVar16 = 0; lVar16 <= *hiA - *loA; lVar16 = lVar16 + 1) {
        lVar10 = lVar10 + *(long *)((long)B_ptr + lVar16 * 8 + lVar14 * 8) *
                          *(long *)((long)A_ptr + lVar16 * 8 + lVar14 * 8);
      }
    }
    *(long *)alen = *(long *)alen + lVar10;
  }
  return;
}

Assistant:

static void snga_dot_local_patch(Integer atype, Integer andim, Integer *loA,
                          Integer *hiA, Integer *ldA, void *A_ptr, void *B_ptr,
                          int *alen, void *retval)
{
  int isum;
  double dsum;
  DoubleComplex zsum;
  SingleComplex csum;
  float fsum;
  long lsum;
  long long llsum;
  Integer i, j, n1dim, idx;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];

  isum = 0; dsum = 0.; zsum.real = 0.; zsum.imag = 0.; fsum = 0;lsum=0;llsum=0;
  csum.real = 0.; csum.imag = 0.;
  
  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<andim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0]; baseldA[1] = baseldA[0] *ldA[1];
  for(i=2; i<andim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseldA[i] = baseldA[i-1] * ldA[i];
  }

  /* compute "local" contribution to the dot product */
  switch (atype){
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          isum += ((int *)A_ptr)[idx+j] *
            ((int *)B_ptr)[idx+j];
      }
      *(int*)retval += isum;
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          zsum.real += a.real*b.real  - b.imag * a.imag;
          zsum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((double*)retval)[0] += zsum.real;
      ((double*)retval)[1] += zsum.imag;
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          csum.real += a.real*b.real  - b.imag * a.imag;
          csum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((float*)retval)[0] += csum.real;
      ((float*)retval)[1] += csum.imag;
      break;
    case  C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          dsum += ((double*)A_ptr)[idx+j] *
            ((double*)B_ptr)[idx+j];
      }
      *(double*)retval += dsum;
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          fsum += ((float *)A_ptr)[idx+j] *
            ((float *)B_ptr)[idx+j];
      }
      *(float*)retval += fsum;
      break;         
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          lsum += ((long *)A_ptr)[idx+j] *
            ((long *)B_ptr)[idx+j];
      }
      *(long*)retval += lsum;
      break;                                     
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          llsum += ((long long *)A_ptr)[idx+j] *
            ((long long *)B_ptr)[idx+j];
      }
      *(long long*)retval += llsum;
      break;
     default:
        pnga_error("snga_dot_local_patch: type not supported",atype);
        
  }
}